

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

LatticeComparison __thiscall
wasm::analysis::Array<wasm::analysis::Bool,_2UL>::compare
          (Array<wasm::analysis::Bool,_2UL> *this,Element *a,Element *b)

{
  LatticeComparison LVar1;
  size_t i;
  long lVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  LVar1 = EQUAL;
  lVar2 = 0;
  do {
    iVar4 = (byte)(a->_M_elems[lVar2] ^ b->_M_elems[lVar2]) + 1;
    iVar3 = 3;
    if (b->_M_elems[lVar2] != false) {
      iVar3 = iVar4;
    }
    if (a->_M_elems[lVar2] == false) {
      iVar3 = iVar4;
    }
    if (iVar3 != 1) {
      if (iVar3 == 3) {
        bVar5 = LVar1 == LESS;
        LVar1 = GREATER;
        if (bVar5) {
          return NO_RELATION;
        }
      }
      else {
        bVar5 = LVar1 == GREATER;
        LVar1 = LESS;
        if (bVar5) {
          return NO_RELATION;
        }
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return LVar1;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    auto result = EQUAL;
    for (size_t i = 0; i < N; ++i) {
      switch (lattice.compare(a[i], b[i])) {
        case NO_RELATION:
          return NO_RELATION;
        case EQUAL:
          continue;
        case LESS:
          if (result == GREATER) {
            // Cannot be both less and greater.
            return NO_RELATION;
          }
          result = LESS;
          continue;
        case GREATER:
          if (result == LESS) {
            // Cannot be both greater and less.
            return NO_RELATION;
          }
          result = GREATER;
          continue;
      }
    }
    return result;
  }